

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v8::detail::format_dragon
          (detail *this,fp value,bool is_predecessor_closer,int num_digits,buffer<char> *buf,
          int *exp10)

{
  buffer<char> *this_00;
  int iVar1;
  type tVar2;
  int iVar3;
  char *pcVar4;
  undefined7 in_register_00000009;
  undefined4 in_register_00000084;
  bool bVar5;
  int local_354;
  int i_1;
  int overflow;
  int result;
  int digit;
  int digit_3;
  int i;
  int iStack_334;
  char digit_2;
  undefined1 local_32e;
  byte local_32d;
  int result_1;
  bool high;
  bool low;
  char *pcStack_328;
  int digit_1;
  char *data;
  uint64_t uStack_318;
  bool even;
  uint64_t significand;
  bigint *pbStack_308;
  int shift;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  undefined1 local_190 [8];
  bigint denominator;
  bigint numerator;
  int *exp10_local;
  buffer<char> *buf_local;
  int num_digits_local;
  bool is_predecessor_closer_local;
  fp value_local;
  
  iVar3 = (int)value.f;
  iVar1 = (int)CONCAT71(in_register_00000009,is_predecessor_closer);
  this_00 = (buffer<char> *)CONCAT44(in_register_00000084,num_digits);
  bigint::bigint((bigint *)&denominator.exp_);
  bigint::bigint((bigint *)local_190);
  bigint::bigint((bigint *)&upper_store.exp_);
  bigint::bigint((bigint *)&upper);
  pbStack_308 = (bigint *)0x0;
  significand._4_4_ = 1;
  if (((undefined1  [16])value & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    significand._4_4_ = 2;
  }
  uStack_318 = (long)this << (sbyte)significand._4_4_;
  if (iVar3 < 0) {
    if (*(int *)&buf->_vptr_buffer < 0) {
      bigint::assign_pow10((bigint *)&denominator.exp_,-*(int *)&buf->_vptr_buffer);
      bigint::assign((bigint *)&upper_store.exp_,(bigint *)&denominator.exp_);
      if (significand._4_4_ != 1) {
        bigint::assign((bigint *)&upper,(bigint *)&denominator.exp_);
        bigint::operator<<=((bigint *)&upper,1);
        pbStack_308 = (bigint *)&upper;
      }
      bigint::operator*=((bigint *)&denominator.exp_,uStack_318);
      bigint::assign((bigint *)local_190,1);
      bigint::operator<<=((bigint *)local_190,significand._4_4_ - iVar3);
    }
    else {
      bigint::assign((bigint *)&denominator.exp_,uStack_318);
      bigint::assign_pow10((bigint *)local_190,*(int *)&buf->_vptr_buffer);
      bigint::operator<<=((bigint *)local_190,significand._4_4_ - iVar3);
      bigint::assign((bigint *)&upper_store.exp_,1);
      if (significand._4_4_ != 1) {
        bigint::assign((bigint *)&upper,2);
        pbStack_308 = (bigint *)&upper;
      }
    }
  }
  else {
    bigint::assign((bigint *)&denominator.exp_,uStack_318);
    bigint::operator<<=((bigint *)&denominator.exp_,iVar3);
    bigint::assign((bigint *)&upper_store.exp_,1);
    bigint::operator<<=((bigint *)&upper_store.exp_,iVar3);
    if (significand._4_4_ != 1) {
      bigint::assign((bigint *)&upper,1);
      bigint::operator<<=((bigint *)&upper,iVar3 + 1);
      pbStack_308 = (bigint *)&upper;
    }
    bigint::assign_pow10((bigint *)local_190,*(int *)&buf->_vptr_buffer);
    bigint::operator<<=((bigint *)local_190,significand._4_4_);
  }
  if (iVar1 < 0) {
    if (pbStack_308 == (bigint *)0x0) {
      pbStack_308 = (bigint *)&upper_store.exp_;
    }
    data._7_1_ = ((ulong)this & 1) == 0;
    buf_local._0_4_ = 0;
    pcStack_328 = buffer<char>::data(this_00);
    while( true ) {
      result_1 = bigint::divmod_assign((bigint *)&denominator.exp_,(bigint *)local_190);
      iVar1 = compare((bigint *)&denominator.exp_,(bigint *)&upper_store.exp_);
      local_32d = (byte)(iVar1 - (data._7_1_ & 1) >> 0x1f);
      iVar1 = add_compare((bigint *)&denominator.exp_,pbStack_308,(bigint *)local_190);
      local_32e = 0 < (int)(iVar1 + (uint)(data._7_1_ & 1));
      iVar1 = (int)buf_local + 1;
      pcStack_328[(int)buf_local] = (char)result_1 + '0';
      if (((local_32d & 1) != 0) || ((bool)local_32e)) break;
      bigint::operator*=((bigint *)&denominator.exp_,10);
      bigint::operator*=((bigint *)&upper_store.exp_,10);
      buf_local._0_4_ = iVar1;
      if (pbStack_308 != (bigint *)&upper_store.exp_) {
        bigint::operator*=(pbStack_308,10);
      }
    }
    if ((local_32d & 1) == 0) {
      pcStack_328[(int)buf_local] = pcStack_328[(int)buf_local] + '\x01';
    }
    else if (((bool)local_32e) &&
            ((iStack_334 = add_compare((bigint *)&denominator.exp_,(bigint *)&denominator.exp_,
                                       (bigint *)local_190), 0 < iStack_334 ||
             ((iStack_334 == 0 && (result_1 % 2 != 0)))))) {
      pcStack_328[(int)buf_local] = pcStack_328[(int)buf_local] + '\x01';
    }
    tVar2 = to_unsigned<int>(iVar1);
    buffer<char>::try_resize(this_00,(ulong)tVar2);
    *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer - (int)buf_local;
    i = 1;
  }
  else {
    *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer - (iVar1 + -1);
    if (iVar1 == 0) {
      bigint::operator*=((bigint *)local_190,10);
      iVar1 = add_compare((bigint *)&denominator.exp_,(bigint *)&denominator.exp_,
                          (bigint *)local_190);
      digit_3._3_1_ = 0 < iVar1 | 0x30;
      buffer<char>::push_back(this_00,(char *)((long)&digit_3 + 3));
      i = 1;
    }
    else {
      tVar2 = to_unsigned<int>(iVar1);
      buffer<char>::try_resize(this_00,(ulong)tVar2);
      for (digit = 0; digit < iVar1 + -1; digit = digit + 1) {
        iVar3 = bigint::divmod_assign((bigint *)&denominator.exp_,(bigint *)local_190);
        result._0_1_ = (char)iVar3;
        pcVar4 = buffer<char>::operator[]<int>(this_00,digit);
        *pcVar4 = (char)result + '0';
        bigint::operator*=((bigint *)&denominator.exp_,10);
      }
      overflow = bigint::divmod_assign((bigint *)&denominator.exp_,(bigint *)local_190);
      iVar3 = add_compare((bigint *)&denominator.exp_,(bigint *)&denominator.exp_,
                          (bigint *)local_190);
      if ((0 < iVar3) || ((iVar3 == 0 && (overflow % 2 != 0)))) {
        if (overflow == 9) {
          pcVar4 = buffer<char>::operator[]<int>(this_00,iVar1 + -1);
          *pcVar4 = ':';
          while( true ) {
            local_354 = iVar1 + -1;
            bVar5 = false;
            if (0 < local_354) {
              pcVar4 = buffer<char>::operator[]<int>(this_00,local_354);
              bVar5 = *pcVar4 == ':';
            }
            if (!bVar5) break;
            pcVar4 = buffer<char>::operator[]<int>(this_00,local_354);
            *pcVar4 = '0';
            pcVar4 = buffer<char>::operator[]<int>(this_00,iVar1 + -2);
            *pcVar4 = *pcVar4 + '\x01';
            iVar1 = local_354;
          }
          pcVar4 = buffer<char>::operator[]<int>(this_00,0);
          if (*pcVar4 == ':') {
            pcVar4 = buffer<char>::operator[]<int>(this_00,0);
            *pcVar4 = '1';
            *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer + 1;
          }
          i = 1;
          goto LAB_0012f708;
        }
        overflow = overflow + 1;
      }
      pcVar4 = buffer<char>::operator[]<int>(this_00,iVar1 + -1);
      *pcVar4 = (char)overflow + '0';
      i = 0;
    }
  }
LAB_0012f708:
  bigint::~bigint((bigint *)&upper);
  bigint::~bigint((bigint *)&upper_store.exp_);
  bigint::~bigint((bigint *)local_190);
  bigint::~bigint((bigint *)&denominator.exp_);
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(fp value, bool is_predecessor_closer,
                                          int num_digits, buffer<char>& buf,
                                          int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}